

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonMonteCarloPricer.cpp
# Opt level: O0

VarianceSwapsHestonMonteCarloPricer * __thiscall
VarianceSwapsHestonMonteCarloPricer::operator=
          (VarianceSwapsHestonMonteCarloPricer *this,VarianceSwapsHestonMonteCarloPricer *mcPricer)

{
  int iVar1;
  undefined4 extraout_var;
  VarianceSwapsHestonMonteCarloPricer *mcPricer_local;
  VarianceSwapsHestonMonteCarloPricer *this_local;
  
  if (this != mcPricer) {
    if (this->hestonPathSimulator_ != (HestonLogSpotPathSimulator *)0x0) {
      (*(this->hestonPathSimulator_->super_PathSimulator)._vptr_PathSimulator[1])();
    }
    iVar1 = (*(mcPricer->hestonPathSimulator_->super_PathSimulator)._vptr_PathSimulator[2])();
    this->hestonPathSimulator_ = (HestonLogSpotPathSimulator *)CONCAT44(extraout_var,iVar1);
  }
  return this;
}

Assistant:

VarianceSwapsHestonMonteCarloPricer& VarianceSwapsHestonMonteCarloPricer::operator=(
                    const VarianceSwapsHestonMonteCarloPricer& mcPricer)
{
    if (this == &mcPricer)
		return *this;
	else
	{
		delete hestonPathSimulator_;												
		hestonPathSimulator_ = mcPricer.hestonPathSimulator_->clone();
	}
	return *this;
}